

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::str_writer<wchar_t>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *this,
          size_t size,align_spec *spec,str_writer<wchar_t> f)

{
  wchar_t wVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  wchar_t *__src;
  ulong uVar7;
  long lVar8;
  basic_buffer<wchar_t> *c;
  wchar_t __tmp;
  size_t sVar9;
  ulong uVar10;
  size_t size_1;
  void *pvVar11;
  ulong uVar12;
  int iVar18;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar25;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  sVar9 = f.size;
  __src = f.s;
  uVar7 = (ulong)spec->width_;
  puVar2 = *(undefined8 **)this;
  lVar8 = puVar2[2];
  uVar12 = uVar7 - size;
  if (uVar7 < size || uVar12 == 0) {
    uVar7 = size + lVar8;
    if ((ulong)puVar2[3] < uVar7) {
      (**(code **)*puVar2)(puVar2,uVar7);
    }
    puVar2[2] = uVar7;
    if (sVar9 != 0) {
      pvVar11 = (void *)(lVar8 * 4 + puVar2[1]);
LAB_0013dd6d:
      memmove(pvVar11,__src,sVar9 << 2);
      return;
    }
  }
  else {
    uVar10 = lVar8 + uVar7;
    if ((ulong)puVar2[3] < uVar10) {
      (**(code **)*puVar2)(puVar2,uVar10);
    }
    puVar2[2] = uVar10;
    auVar6 = _DAT_001440d0;
    auVar5 = _DAT_001440c0;
    auVar4 = _DAT_001440b0;
    lVar3 = puVar2[1];
    pvVar11 = (void *)(lVar3 + lVar8 * 4);
    wVar1 = spec->fill_;
    if (spec->align_ == ALIGN_CENTER) {
      uVar10 = uVar12 >> 1;
      if (1 < uVar12) {
        pvVar11 = (void *)((long)pvVar11 + uVar10 * 4);
        uVar12 = uVar10 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar23._8_4_ = (int)uVar12;
        auVar23._0_8_ = uVar12;
        auVar23._12_4_ = (int)(uVar12 >> 0x20);
        lVar3 = lVar3 + lVar8 * 4;
        lVar8 = 0;
        auVar23 = auVar23 ^ _DAT_001440d0;
        do {
          auVar20._8_4_ = (int)lVar8;
          auVar20._0_8_ = lVar8;
          auVar20._12_4_ = (int)((ulong)lVar8 >> 0x20);
          auVar24 = (auVar20 | auVar5) ^ auVar6;
          iVar18 = auVar23._4_4_;
          if ((bool)(~(auVar24._4_4_ == iVar18 && auVar23._0_4_ < auVar24._0_4_ ||
                      iVar18 < auVar24._4_4_) & 1)) {
            *(wchar_t *)(lVar3 + lVar8 * 4) = wVar1;
          }
          if ((auVar24._12_4_ != auVar23._12_4_ || auVar24._8_4_ <= auVar23._8_4_) &&
              auVar24._12_4_ <= auVar23._12_4_) {
            *(wchar_t *)(lVar3 + 4 + lVar8 * 4) = wVar1;
          }
          auVar20 = (auVar20 | auVar4) ^ auVar6;
          iVar25 = auVar20._4_4_;
          if (iVar25 <= iVar18 && (iVar25 != iVar18 || auVar20._0_4_ <= auVar23._0_4_)) {
            *(wchar_t *)(lVar3 + 8 + lVar8 * 4) = wVar1;
            *(wchar_t *)(lVar3 + 0xc + lVar8 * 4) = wVar1;
          }
          lVar8 = lVar8 + 4;
        } while ((uVar12 - ((uint)(uVar10 + 0x3fffffffffffffff) & 3)) + 4 != lVar8);
      }
      if (sVar9 != 0) {
        memmove(pvVar11,__src,sVar9 * 4);
        pvVar11 = (void *)((long)pvVar11 + sVar9 * 4);
      }
      auVar6 = _DAT_001440d0;
      auVar5 = _DAT_001440c0;
      auVar4 = _DAT_001440b0;
      uVar12 = (uVar7 * 4 + (uVar10 + size) * -4) - 4;
      auVar24._8_4_ = (int)uVar12;
      auVar24._0_8_ = uVar12;
      auVar24._12_4_ = (int)(uVar12 >> 0x20);
      auVar15._0_8_ = uVar12 >> 2;
      auVar15._8_8_ = auVar24._8_8_ >> 2;
      uVar7 = 0;
      auVar15 = auVar15 ^ _DAT_001440d0;
      do {
        auVar21._8_4_ = (int)uVar7;
        auVar21._0_8_ = uVar7;
        auVar21._12_4_ = (int)(uVar7 >> 0x20);
        auVar23 = (auVar21 | auVar5) ^ auVar6;
        iVar18 = auVar15._4_4_;
        if ((bool)(~(auVar23._4_4_ == iVar18 && auVar15._0_4_ < auVar23._0_4_ ||
                    iVar18 < auVar23._4_4_) & 1)) {
          *(wchar_t *)((long)pvVar11 + uVar7 * 4) = wVar1;
        }
        if ((auVar23._12_4_ != auVar15._12_4_ || auVar23._8_4_ <= auVar15._8_4_) &&
            auVar23._12_4_ <= auVar15._12_4_) {
          *(wchar_t *)((long)pvVar11 + uVar7 * 4 + 4) = wVar1;
        }
        auVar23 = (auVar21 | auVar4) ^ auVar6;
        iVar25 = auVar23._4_4_;
        if (iVar25 <= iVar18 && (iVar25 != iVar18 || auVar23._0_4_ <= auVar15._0_4_)) {
          *(wchar_t *)((long)pvVar11 + uVar7 * 4 + 8) = wVar1;
          *(wchar_t *)((long)pvVar11 + uVar7 * 4 + 0xc) = wVar1;
        }
        uVar7 = uVar7 + 4;
      } while (((uVar12 >> 2) + 4 & 0x7ffffffffffffffc) != uVar7);
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      pvVar11 = (void *)((long)pvVar11 + uVar12 * 4);
      uVar12 = (uVar7 * 4 + size * -4) - 4;
      auVar13._8_4_ = (int)uVar12;
      auVar13._0_8_ = uVar12;
      auVar13._12_4_ = (int)(uVar12 >> 0x20);
      auVar14._0_8_ = uVar12 >> 2;
      auVar14._8_8_ = auVar13._8_8_ >> 2;
      lVar3 = lVar3 + lVar8 * 4;
      uVar7 = 0;
      auVar14 = auVar14 ^ _DAT_001440d0;
      do {
        auVar19._8_4_ = (int)uVar7;
        auVar19._0_8_ = uVar7;
        auVar19._12_4_ = (int)(uVar7 >> 0x20);
        auVar23 = (auVar19 | auVar5) ^ auVar6;
        iVar18 = auVar14._4_4_;
        if ((bool)(~(auVar23._4_4_ == iVar18 && auVar14._0_4_ < auVar23._0_4_ ||
                    iVar18 < auVar23._4_4_) & 1)) {
          *(wchar_t *)(lVar3 + uVar7 * 4) = wVar1;
        }
        if ((auVar23._12_4_ != auVar14._12_4_ || auVar23._8_4_ <= auVar14._8_4_) &&
            auVar23._12_4_ <= auVar14._12_4_) {
          *(wchar_t *)(lVar3 + 4 + uVar7 * 4) = wVar1;
        }
        auVar23 = (auVar19 | auVar4) ^ auVar6;
        iVar25 = auVar23._4_4_;
        if (iVar25 <= iVar18 && (iVar25 != iVar18 || auVar23._0_4_ <= auVar14._0_4_)) {
          *(wchar_t *)(lVar3 + 8 + uVar7 * 4) = wVar1;
          *(wchar_t *)(lVar3 + 0xc + uVar7 * 4) = wVar1;
        }
        uVar7 = uVar7 + 4;
      } while (((uVar12 >> 2) + 4 & 0x7ffffffffffffffc) != uVar7);
      if (sVar9 != 0) goto LAB_0013dd6d;
    }
    else {
      if (sVar9 != 0) {
        memmove(pvVar11,__src,sVar9 * 4);
        pvVar11 = (void *)((long)pvVar11 + sVar9 * 4);
      }
      auVar6 = _DAT_001440d0;
      auVar5 = _DAT_001440c0;
      auVar4 = _DAT_001440b0;
      uVar12 = (uVar7 * 4 + size * -4) - 4;
      auVar16._8_4_ = (int)uVar12;
      auVar16._0_8_ = uVar12;
      auVar16._12_4_ = (int)(uVar12 >> 0x20);
      auVar17._0_8_ = uVar12 >> 2;
      auVar17._8_8_ = auVar16._8_8_ >> 2;
      uVar7 = 0;
      auVar17 = auVar17 ^ _DAT_001440d0;
      do {
        auVar22._8_4_ = (int)uVar7;
        auVar22._0_8_ = uVar7;
        auVar22._12_4_ = (int)(uVar7 >> 0x20);
        auVar23 = (auVar22 | auVar5) ^ auVar6;
        iVar18 = auVar17._4_4_;
        if ((bool)(~(auVar23._4_4_ == iVar18 && auVar17._0_4_ < auVar23._0_4_ ||
                    iVar18 < auVar23._4_4_) & 1)) {
          *(wchar_t *)((long)pvVar11 + uVar7 * 4) = wVar1;
        }
        if ((auVar23._12_4_ != auVar17._12_4_ || auVar23._8_4_ <= auVar17._8_4_) &&
            auVar23._12_4_ <= auVar17._12_4_) {
          *(wchar_t *)((long)pvVar11 + uVar7 * 4 + 4) = wVar1;
        }
        auVar23 = (auVar22 | auVar4) ^ auVar6;
        iVar25 = auVar23._4_4_;
        if (iVar25 <= iVar18 && (iVar25 != iVar18 || auVar23._0_4_ <= auVar17._0_4_)) {
          *(wchar_t *)((long)pvVar11 + uVar7 * 4 + 8) = wVar1;
          *(wchar_t *)((long)pvVar11 + uVar7 * 4 + 0xc) = wVar1;
        }
        uVar7 = uVar7 + 4;
      } while (((uVar12 >> 2) + 4 & 0x7ffffffffffffffc) != uVar7);
    }
  }
  return;
}

Assistant:

void basic_writer<Range>::write_padded(
    std::size_t size, const align_spec &spec, F f) {
  unsigned width = spec.width();
  if (width <= size)
    return f(reserve(size));
  auto &&it = reserve(width);
  char_type fill = static_cast<char_type>(spec.fill());
  std::size_t padding = width - size;
  if (spec.align() == ALIGN_RIGHT) {
    it = std::fill_n(it, padding, fill);
    f(it);
  } else if (spec.align() == ALIGN_CENTER) {
    std::size_t left_padding = padding / 2;
    it = std::fill_n(it, left_padding, fill);
    f(it);
    it = std::fill_n(it, padding - left_padding, fill);
  } else {
    f(it);
    it = std::fill_n(it, padding, fill);
  }
}